

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O2

URegistryKey __thiscall
icu_63::ICULocaleService::registerInstance
          (ICULocaleService *this,UObject *objToAdopt,Locale *locale,int32_t kind,int32_t coverage,
          UErrorCode *status)

{
  int iVar1;
  SimpleLocaleKeyFactory *this_00;
  undefined4 extraout_var;
  
  this_00 = (SimpleLocaleKeyFactory *)UMemory::operator_new((UMemory *)0xa0,(size_t)objToAdopt);
  if (this_00 != (SimpleLocaleKeyFactory *)0x0) {
    SimpleLocaleKeyFactory::SimpleLocaleKeyFactory(this_00,objToAdopt,locale,kind,coverage);
    iVar1 = (*(this->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[9])(this,this_00,status);
    return (URegistryKey)CONCAT44(extraout_var,iVar1);
  }
  if (objToAdopt != (UObject *)0x0) {
    (*objToAdopt->_vptr_UObject[1])(objToAdopt);
  }
  return (URegistryKey)0x0;
}

Assistant:

URegistryKey
ICULocaleService::registerInstance(UObject* objToAdopt, const Locale& locale, int32_t kind, int32_t coverage, UErrorCode& status)
{
    ICUServiceFactory * factory = new SimpleLocaleKeyFactory(objToAdopt, locale, kind, coverage);
    if (factory != NULL) {
        return registerFactory(factory, status);
    }
    delete objToAdopt;
    return NULL;
}